

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall pugi::impl::anon_unknown_0::xpath_allocator::release(xpath_allocator *this)

{
  long *plVar1;
  undefined8 *in_RDI;
  xpath_memory_block *next;
  xpath_memory_block *cur;
  undefined8 local_10;
  
  local_10 = (long *)*in_RDI;
  while (*local_10 != 0) {
    plVar1 = (long *)*local_10;
    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
              (local_10);
    local_10 = plVar1;
  }
  return;
}

Assistant:

void release()
		{
			xpath_memory_block* cur = _root;
			assert(cur);

			while (cur->next)
			{
				xpath_memory_block* next = cur->next;

				xml_memory::deallocate(cur);

				cur = next;
			}
		}